

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall asl::Console::bgcolor(Console *this,int r,int g,int b)

{
  String local_60;
  String local_48;
  
  String::String(&local_48,"\x1b[48;");
  rgb(&local_60,this,r,g,b);
  if (local_48._size == 0) {
    local_48.field_2._str = (char *)&local_48.field_2;
  }
  if (local_60._size == 0) {
    local_60.field_2._str = (char *)&local_60.field_2;
  }
  printf("%s%s",local_48.field_2._str,local_60.field_2._str);
  String::~String(&local_60);
  String::~String(&local_48);
  return;
}

Assistant:

void Console::bgcolor(int r, int g, int b)
{
	printf("%s%s", *bg(), *rgb(r, g, b));
}